

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

uint64 bins_encode(bins_t *bins,float32 value)

{
  float *pfVar1;
  bins_t *pbVar2;
  int iVar3;
  ulong uVar4;
  bins_t *in_RSI;
  
  uVar4 = (ulong)((long)in_RSI - (long)bins) >> 2;
  pbVar2 = bins;
  if (0 < (int)uVar4) {
    do {
      iVar3 = (int)uVar4;
      uVar4 = uVar4 >> 1 & 0x7fffffff;
      pfVar1 = (float *)((long)&pbVar2->begin + uVar4 * 4);
      if (*pfVar1 <= (float)value && (float)value != *pfVar1) {
        pbVar2 = (bins_t *)((long)&pbVar2->begin + uVar4 * 4 + 4);
        uVar4 = (ulong)(iVar3 + ~(uint)uVar4);
      }
    } while (0 < (int)uVar4);
    if ((long)pbVar2 - (long)bins != 0) {
      if (pbVar2 == in_RSI) {
        return ((long)in_RSI - (long)bins >> 2) - 1;
      }
      return ((long)pbVar2 - (long)bins >> 2) -
             (ulong)((float)value - *(float *)((long)&pbVar2[-1].end + 4) <
                    *(float *)&pbVar2->begin - (float)value);
    }
  }
  return 0;
}

Assistant:

static float32 *
lower_bound(float32 *first, const float32 *last, float32 val)
{
    int count, step;
    float32 *it;

    count = last - first;
    while (count > 0) {
        it = first;
        step = count / 2;
        it += step;
        if (*it < val) {
            first = ++it;
            count -= step + 1;
        }
        else {
            count = step;
        }
    }
    return first;
}